

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_reader.cpp
# Opt level: O2

ssize_t __thiscall diffusion::ShmReader::read(ShmReader *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  ErrorNoData *this_00;
  undefined4 in_register_00000034;
  ShmReader *this_01;
  vector<char,_std::allocator<char>_> body_size_buffer;
  
  this_01 = (ShmReader *)CONCAT44(in_register_00000034,__fd);
  iVar1 = (**(this_01->super_Reader)._vptr_Reader)(this_01);
  if ((char)iVar1 != '\0') {
    cyclic_read(&body_size_buffer,this_01,4);
    cyclic_read((vector<char,_std::allocator<char>_> *)this,this_01,
                *(Size *)body_size_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&body_size_buffer.super__Vector_base<char,_std::allocator<char>_>);
    return (ssize_t)this;
  }
  this_00 = (ErrorNoData *)__cxa_allocate_exception(0x10);
  ErrorNoData::ErrorNoData(this_00);
  __cxa_throw(this_00,&ErrorNoData::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<char> ShmReader::read() {
    if (!this->can_read()) {
        throw ErrorNoData();
    }
    auto body_size_buffer = this->cyclic_read(sizeof(Size)); // avoid unaligned access.
    auto body_size = read_aligned_object<Size>(body_size_buffer.data());
    auto body = this->cyclic_read(body_size);
    return body;
}